

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_graph_quantity.cpp
# Opt level: O0

void __thiscall polyscope::SurfaceGraphQuantity::buildCustomUI(SurfaceGraphQuantity *this)

{
  bool bVar1;
  vec<3,_float,_(glm::qualifier)0> *this_00;
  char *format;
  size_type sVar2;
  ScaledValue<float> *this_01;
  SurfaceGraphQuantity *in_RDI;
  undefined1 auVar4 [56];
  vec3 vVar5;
  float *in_stack_ffffffffffffffb8;
  float *in_stack_ffffffffffffffc8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_ffffffffffffffe4;
  undefined1 auVar3 [64];
  
  auVar4 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  ImGui::SameLine((float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
  this_00 = PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::get(&in_RDI->color);
  glm::vec<3,_float,_(glm::qualifier)0>::operator[](this_00,0);
  bVar1 = ImGui::ColorEdit3((char *)in_RDI,in_stack_ffffffffffffffb8,0);
  if (bVar1) {
    vVar5 = getColor(in_RDI);
    in_stack_ffffffffffffffd0 = vVar5.field_2;
    auVar3._0_8_ = vVar5._0_8_;
    auVar3._8_56_ = auVar4;
    in_stack_ffffffffffffffc8 = (float *)vmovlpd_avx(auVar3._0_16_);
    vVar5.field_1.y = in_stack_ffffffffffffffd0.z;
    vVar5.field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
         (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    vVar5.field_2 = in_stack_ffffffffffffffe4;
    setColor(in_RDI,vVar5);
  }
  format = (char *)std::
                   vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ::size(&in_RDI->nodes);
  sVar2 = std::
          vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>::
          size(&in_RDI->edges);
  ImGui::Text("Nodes: %lu  Edges: %lu",format,sVar2);
  this_01 = PersistentValue<polyscope::ScaledValue<float>_>::get(&in_RDI->radius);
  ScaledValue<float>::getValuePtr(this_01);
  bVar1 = ImGui::SliderFloat((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffc8,(float)((ulong)in_RDI >> 0x20),
                             SUB84(in_RDI,0),format,0.0);
  if (bVar1) {
    PersistentValue<polyscope::ScaledValue<float>_>::manuallyChanged
              ((PersistentValue<polyscope::ScaledValue<float>_> *)in_RDI);
    requestRedraw();
  }
  return;
}

Assistant:

void SurfaceGraphQuantity::buildCustomUI() {
  ImGui::SameLine();
  if (ImGui::ColorEdit3("Color", &color.get()[0], ImGuiColorEditFlags_NoInputs)) setColor(getColor());
  ImGui::Text("Nodes: %lu  Edges: %lu", nodes.size(), edges.size());
  if (ImGui::SliderFloat("Radius", radius.get().getValuePtr(), 0.0, .1, "%.5f", 3.)) {
    radius.manuallyChanged();
    requestRedraw();
  }
}